

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O1

int testValid_TargetOneOfTwoModelInputs(void)

{
  int iVar1;
  string *psVar2;
  bool bVar3;
  TypeUnion TVar4;
  NetworkUpdateParameters *this;
  Type *this_00;
  CategoricalCrossEntropyLossLayer *pCVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  ostream *poVar10;
  ArenaStringPtr *this_01;
  int iVar11;
  Model spec;
  Result res;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  undefined1 local_148 [24];
  Model local_130;
  pointer local_100;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_d8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_a8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_78;
  TensorAttributes local_48;
  TensorAttributes local_38;
  
  CoreML::Specification::Model::Model(&local_130);
  CoreML::Result::Result((Result *)&local_100);
  local_38.name = "InTensor";
  local_38.dimension = 3;
  local_38._12_4_ = 0;
  local_48.name = "OutTensor";
  local_48.dimension = 1;
  local_48._12_4_ = 0;
  buildBasicNeuralNetworkModel(&local_130,true,&local_38,&local_48,0x400,false,false);
  local_130.specificationversion_ = 4;
  if (local_130._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_130);
    local_130._oneof_case_[0] = 500;
    TVar4.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar4.neuralnetwork_);
    local_130.Type_.pipelineclassifier_ = TVar4.pipelineclassifier_;
  }
  TVar4 = local_130.Type_;
  addSoftmaxLayer(&local_130,"softmax","OutTensor","softmax_out");
  if ((TVar4.neuralnetworkregressor_)->updateparams_ == (NetworkUpdateParameters *)0x0) {
    this = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this);
    (TVar4.neuralnetworkregressor_)->updateparams_ = this;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&((TVar4.neuralnetworkregressor_)->updateparams_->losslayers_).
                        super_RepeatedPtrFieldBase,(Type *)0x0);
  local_158 = (undefined1  [8])local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"cross_entropy_loss_layer","")
  ;
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_00->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_158);
  if (local_158 != (undefined1  [8])local_148) {
    operator_delete((void *)local_158,local_148._0_8_ + 1);
  }
  if (this_00->_oneof_case_[0] != 10) {
    CoreML::Specification::LossLayer::clear_LossLayerType(this_00);
    this_00->_oneof_case_[0] = 10;
    pCVar5 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
    CoreML::Specification::CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer
              (pCVar5);
    (this_00->LossLayerType_).categoricalcrossentropylosslayer_ = pCVar5;
  }
  pCVar5 = (this_00->LossLayerType_).categoricalcrossentropylosslayer_;
  local_158 = (undefined1  [8])local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"softmax_out","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pCVar5->input_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_158);
  if (local_158 != (undefined1  [8])local_148) {
    operator_delete((void *)local_158,local_148._0_8_ + 1);
  }
  local_158 = (undefined1  [8])local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"target","");
  this_01 = &pCVar5->target_;
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (this_01,(string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_158);
  if (local_158 != (undefined1  [8])local_148) {
    operator_delete((void *)local_158,local_148._0_8_ + 1);
  }
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (TVar4.neuralnetwork_,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl._0_8_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (TVar4.neuralnetwork_,kSgdOptimizer,10,5,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_78);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_78);
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl._0_8_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  addEpochs<CoreML::Specification::NeuralNetwork>
            (TVar4.neuralnetwork_,100,1,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_a8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_a8);
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl._0_8_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (TVar4.neuralnetwork_,0x7e3,0,0x7e3,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_d8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_d8);
  if (local_130.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_130.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_130.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_158 = (undefined1  [8])local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"fakeInput","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_158);
  if (local_158 != (undefined1  [8])local_148) {
    operator_delete((void *)local_158,local_148._0_8_ + 1);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pAVar9->datatype_ = 0x10020;
  iVar11 = 3;
  do {
    iVar1 = (pAVar9->shape_).total_size_;
    if ((pAVar9->shape_).current_size_ == iVar1) {
      google::protobuf::RepeatedField<long>::Reserve(&pAVar9->shape_,iVar1 + 1);
    }
    iVar1 = (pAVar9->shape_).current_size_;
    (pAVar9->shape_).current_size_ = iVar1 + 1;
    ((pAVar9->shape_).rep_)->elements[iVar1] = 1;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  if (local_130.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_130.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_130.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  psVar2 = (pTVar7->name_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar7->name_,this_01->ptr_);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pAVar9->datatype_ = 0x20020;
  iVar11 = (pAVar9->shape_).total_size_;
  if ((pAVar9->shape_).current_size_ == iVar11) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar9->shape_,iVar11 + 1);
  }
  iVar11 = (pAVar9->shape_).current_size_;
  (pAVar9->shape_).current_size_ = iVar11 + 1;
  ((pAVar9->shape_).rep_)->elements[iVar11] = 1;
  CoreML::Model::validate((Result *)local_158,&local_130);
  local_100 = (pointer)local_158;
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_150);
  if (local_150._M_p != local_148 + 8) {
    operator_delete(local_150._M_p,local_148._8_8_ + 1);
  }
  bVar3 = CoreML::Result::good((Result *)&local_100);
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x80d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_130);
  return (uint)!bVar3;
}

Assistant:

int testValid_TargetOneOfTwoModelInputs() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    Specification::NetworkUpdateParameters *updateParams = neuralNet->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("cross_entropy_loss_layer");
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input("softmax_out");
    ceLossLayer->set_target("target");

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    auto inTensor = spec.mutable_description()->add_input();
    inTensor->set_name("fakeInput");
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < 3; i++) {
        inTensorShape->add_shape(1);
    }
    // Added input but didn't add this to the training inputs

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(ceLossLayer->target());
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}